

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_classes.cc
# Opt level: O0

void add_samples(teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                 *teacher)

{
  long lVar1;
  allocator<double> *this;
  sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> local_a8;
  allocator<double> local_71;
  undefined1 local_70 [8];
  vector<double,_std::allocator<double>_> desired;
  allocator<double> local_41;
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> input;
  double *inp_end;
  double *inp_beg;
  int i;
  teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  *teacher_local;
  
  for (inp_beg._4_4_ = 0; inp_beg._4_4_ < 3; inp_beg._4_4_ = inp_beg._4_4_ + 1) {
    lVar1 = (long)inp_beg._4_4_;
    input.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = learning_samples[lVar1] + 2;
    std::allocator<double>::allocator(&local_41);
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)local_40,learning_samples[lVar1],
               learning_samples[lVar1] + 2,&local_41);
    std::allocator<double>::~allocator(&local_41);
    this = &local_71;
    std::allocator<double>::allocator(this);
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)local_70,learning_samples[lVar1] + 2,
               learning_samples[lVar1 + 1],this);
    std::allocator<double>::~allocator(&local_71);
    klogic::transform::
    continuous<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,std::vector<double,std::allocator<double>>>
              (&local_a8,(transform *)local_40,(vector<double,_std::allocator<double>_> *)local_70,
               (vector<double,_std::allocator<double>_> *)this);
    klogic::learning::
    teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
    ::add_sample(teacher,&local_a8);
    klogic::learning::
    sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::~sample
              (&local_a8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_70);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_40);
  }
  return;
}

Assistant:

void add_samples(learning::teacher<mlmvn> &teacher) 
{
    for (int i = 0; i < nsamples; ++i) {
        const double *inp_beg = &learning_samples[i][0], *inp_end = inp_beg + 2;
        vector<double> input(inp_beg, inp_end);
        vector<double> desired(inp_beg + 2, inp_beg + 3);

        teacher.add_sample(transform::continuous<cvector>(input, desired));
    }
}